

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgregoriancalendar.cpp
# Opt level: O1

YearMonthDay QGregorianCalendar::partsFromJulian(qint64 jd)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  uint uVar7;
  int iVar8;
  YearMonthDay YVar9;
  
  if (jd < 0x1a4320) {
    uVar6 = (jd * 4 + -0x690c7c) / 0x23ab1 - 1;
  }
  else {
    uVar6 = (jd * 4 - 0x690c7dU) / 0x23ab1;
  }
  uVar4 = uVar6 * 0x23ab1;
  if ((long)uVar6 < 0) {
    lVar5 = uVar4 + 4;
    if (-1 < (long)(uVar4 + 1)) {
      lVar5 = uVar4 + 1;
    }
    iVar8 = (int)(lVar5 >> 2) + -1;
  }
  else {
    iVar8 = (int)(uVar4 >> 2);
  }
  iVar8 = ((int)jd + -0x1a431f) - iVar8;
  if (iVar8 < 1) {
    uVar2 = (iVar8 * 4) / 0x5b5 - 1;
  }
  else {
    uVar2 = (iVar8 * 4 - 1U) / 0x5b5;
  }
  iVar8 = iVar8 - (uVar2 * 0x5b5 >> 2);
  iVar3 = iVar8 * 5;
  if (iVar8 < 1) {
    iVar3 = iVar3 + (int)((ulong)((long)(iVar3 + -2) * -0x29d47f29) >> 0x20) + -2;
    uVar7 = ((iVar3 >> 7) - (iVar3 >> 0x1f)) - 1;
  }
  else {
    uVar7 = (iVar3 - 3U) / 0x99;
  }
  uVar1 = uVar7 - 0xc;
  if ((int)uVar7 < 10) {
    uVar1 = uVar7;
  }
  iVar3 = (uint)(9 < (int)uVar7) + (int)uVar6 * 100 + uVar2;
  YVar9.year = iVar3 - (uint)(iVar3 < 1);
  YVar9.month = uVar1 + 3;
  YVar9.day = iVar8 - (uVar7 * 0x99 + 2) / 5;
  return YVar9;
}

Assistant:

QCalendar::YearMonthDay QGregorianCalendar::partsFromJulian(qint64 jd)
{
    const qint64 dayNumber = jd - BaseJd;
    const qint64 century = qDiv<FourCenturies>(4 * dayNumber - 1);
    const int dayInCentury = dayNumber - qDiv<4>(FourCenturies * century);

    const int yearInCentury = qDiv<FourYears>(4 * dayInCentury - 1);
    const int dayInYear = dayInCentury - qDiv<4>(FourYears * yearInCentury);
    const int m = qDiv<FiveMonths>(5 * dayInYear - 3);
    Q_ASSERT(m < 12 && m >= 0);
    // That m is a month adjusted to March = 0, with Jan = 10, Feb = 11 in the previous year.
    const int yearOffset = m < 10 ? 0 : 1;

    const int y = 100 * century + yearInCentury + yearOffset;
    const int month = m + 3 - 12 * yearOffset;
    const int day = dayInYear - qDiv<5>(FiveMonths * m + 2);

    // Adjust for no year 0
    return QCalendar::YearMonthDay(y > 0 ? y : y - 1, month, day);
}